

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SingleFileStorageManager::LoadDatabase
          (SingleFileStorageManager *this,StorageOptions storage_options)

{
  string *path_p;
  unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true> *this_00;
  AttachedDatabase *pAVar1;
  _Head_base<0UL,_duckdb::BlockManager_*,_false> _Var2;
  _Head_base<0UL,_duckdb::TableIOManager_*,_false> _Var3;
  _Head_base<0UL,_duckdb::WriteAheadLog_*,_false> _Var4;
  optional_idx block_alloc_size_p;
  _func_int **pp_Var5;
  int iVar6;
  FileSystem *pFVar7;
  DBConfig *pDVar8;
  TableIOManager TVar9;
  NotImplementedException *pNVar10;
  BufferManager *buffer_manager;
  _Head_base<0UL,_duckdb::BlockManager_*,_false> _Var11;
  idx_t iVar12;
  SingleFileBlockManager *pSVar13;
  pointer pSVar14;
  TableIOManager TVar15;
  _Head_base<0UL,_duckdb::TableIOManager_*,_false> _Var16;
  pointer pBVar17;
  idx_t iVar18;
  _Head_base<0UL,_duckdb::WriteAheadLog_*,_false> _Var19;
  InvalidInputException *pIVar20;
  StorageManagerOptions options;
  string local_b8;
  _Head_base<0UL,_duckdb::BlockManager_*,_false> local_98;
  SingleFileCheckpointReader local_90;
  StorageManagerOptions local_78;
  FileSystem *local_48;
  _Head_base<0UL,_duckdb::WriteAheadLog_*,_false> local_40;
  AttachedDatabase *local_38;
  
  path_p = &(this->super_StorageManager).path;
  iVar6 = ::std::__cxx11::string::compare((char *)path_p);
  pAVar1 = (this->super_StorageManager).db;
  if (iVar6 == 0) {
    buffer_manager = BufferManager::GetBufferManager(pAVar1);
    _Var11._M_head_impl = (BlockManager *)operator_new(0x88);
    optional_idx::optional_idx((optional_idx *)&local_78,0x40000);
    optional_idx::optional_idx((optional_idx *)&local_b8,8);
    block_alloc_size_p.index._1_1_ = local_78.use_direct_io;
    block_alloc_size_p.index._0_1_ = local_78.read_only;
    block_alloc_size_p.index._2_1_ = local_78.debug_initialize;
    block_alloc_size_p.index._3_5_ = local_78._3_5_;
    BlockManager::BlockManager
              (_Var11._M_head_impl,buffer_manager,block_alloc_size_p,
               (optional_idx)local_b8._M_dataplus._M_p);
    (_Var11._M_head_impl)->_vptr_BlockManager = (_func_int **)&PTR__BlockManager_019afe90;
    _Var2._M_head_impl =
         (this->block_manager).
         super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
         super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
         super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl;
    (this->block_manager).
    super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
    super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = _Var11._M_head_impl;
    if (_Var2._M_head_impl != (BlockManager *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_BlockManager + 8))();
    }
    TVar9._vptr_TableIOManager =
         (_func_int **)
         unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
         operator*(&this->block_manager);
    _Var16._M_head_impl = (TableIOManager *)operator_new(0x18);
    (_Var16._M_head_impl)->_vptr_TableIOManager = (_func_int **)&PTR__TableIOManager_019aff70;
    _Var16._M_head_impl[1]._vptr_TableIOManager = TVar9._vptr_TableIOManager;
    _Var16._M_head_impl[2]._vptr_TableIOManager = (_func_int **)0x1e000;
    _Var3._M_head_impl =
         (this->table_io_manager).
         super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>
         .super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl;
    (this->table_io_manager).
    super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>.
    super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl = _Var16._M_head_impl;
    if (_Var3._M_head_impl == (TableIOManager *)0x0) {
      return;
    }
    (*(_Var3._M_head_impl)->_vptr_TableIOManager[1])();
    return;
  }
  pFVar7 = FileSystem::Get(pAVar1);
  pDVar8 = DBConfig::Get((this->super_StorageManager).db);
  local_78.block_alloc_size.index = 0xffffffffffffffff;
  local_78.version_number.index._0_4_ = 0xffffffff;
  local_78.version_number.index._4_4_ = 0xffffffff;
  local_78.block_header_size.index = 0xffffffffffffffff;
  local_78.encryption = false;
  local_78.read_only = (this->super_StorageManager).read_only;
  local_78.use_direct_io = (pDVar8->options).use_direct_io;
  local_78.debug_initialize = (pDVar8->options).debug_initialize;
  local_78.storage_version.index = storage_options.storage_version.index;
  if (storage_options.row_group_size.index == 0xffffffffffffffff) {
    TVar9._vptr_TableIOManager = (_func_int **)0x1e000;
  }
  else {
    TVar9._vptr_TableIOManager =
         (_func_int **)optional_idx::GetIndex(&storage_options.row_group_size);
    if (TVar9._vptr_TableIOManager == (_func_int **)0x0) {
      pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,
                 "Invalid row group size: %llu - row group size must be bigger than 0","");
      NotImplementedException::NotImplementedException<unsigned_long>(pNVar10,&local_b8,0);
      __cxa_throw(pNVar10,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((ulong)TVar9._vptr_TableIOManager & 0x7ff) != 0) {
      pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,
                 "Invalid row group size: %llu - row group size must be divisible by the vector size (%llu)"
                 ,"");
      NotImplementedException::NotImplementedException<unsigned_long,unsigned_int>
                (pNVar10,&local_b8,(unsigned_long)TVar9._vptr_TableIOManager,0x800);
      __cxa_throw(pNVar10,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  local_48 = pFVar7;
  if (((this->super_StorageManager).read_only == false) &&
     (iVar6 = (*pFVar7->_vptr_FileSystem[0x13])(pFVar7,path_p,0), (char)iVar6 == '\0')) {
    StorageManager::GetWALPath_abi_cxx11_(&local_b8,&this->super_StorageManager);
    iVar6 = (*pFVar7->_vptr_FileSystem[0x13])(pFVar7,&local_b8,0);
    if ((char)iVar6 != '\0') {
      (*local_48->_vptr_FileSystem[0x15])(local_48,&local_b8,0);
    }
    if (storage_options.block_alloc_size.index == 0xffffffffffffffff) {
      optional_idx::optional_idx
                ((optional_idx *)&local_90,(pDVar8->options).default_block_alloc_size);
      local_78.block_alloc_size.index =
           (idx_t)local_90.super_CheckpointReader._vptr_CheckpointReader;
    }
    else {
      iVar12 = optional_idx::GetIndex(&storage_options.block_alloc_size);
      Storage::VerifyBlockAllocSize(iVar12);
      local_78.block_alloc_size = storage_options.block_alloc_size;
    }
    if (storage_options.block_header_size.index == 0xffffffffffffffff) {
      optional_idx::optional_idx
                ((optional_idx *)&local_90,(pDVar8->options).default_block_header_size);
      local_78.block_header_size.index =
           (idx_t)local_90.super_CheckpointReader._vptr_CheckpointReader;
    }
    else {
      iVar12 = optional_idx::GetIndex(&storage_options.block_header_size);
      Storage::VerifyBlockHeaderSize(iVar12);
      local_78.block_header_size.index = storage_options.block_header_size.index;
      local_78.encryption = storage_options.encryption;
      local_78.storage_version.index = storage_options.storage_version.index;
    }
    if ((pointer)local_78.storage_version.index == (pointer)0xffffffffffffffff) {
      optional_idx::optional_idx
                ((optional_idx *)&local_90,
                 (pDVar8->options).serialization_compatibility.serialization_version);
      local_78.storage_version.index = (idx_t)local_90.super_CheckpointReader._vptr_CheckpointReader
      ;
    }
    pAVar1 = (this->super_StorageManager).db;
    pSVar13 = (SingleFileBlockManager *)operator_new(0x240);
    SingleFileBlockManager::SingleFileBlockManager(pSVar13,pAVar1,path_p,&local_78);
    local_90.super_CheckpointReader._vptr_CheckpointReader = (_func_int **)pSVar13;
    pSVar14 = unique_ptr<duckdb::SingleFileBlockManager,_std::default_delete<duckdb::SingleFileBlockManager>,_true>
              ::operator->((unique_ptr<duckdb::SingleFileBlockManager,_std::default_delete<duckdb::SingleFileBlockManager>,_true>
                            *)&local_90);
    SingleFileBlockManager::CreateNewDatabase(pSVar14);
    pp_Var5 = local_90.super_CheckpointReader._vptr_CheckpointReader;
    local_90.super_CheckpointReader._vptr_CheckpointReader = (_func_int **)0x0;
    _Var2._M_head_impl =
         (this->block_manager).
         super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
         super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
         super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl;
    (this->block_manager).
    super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
    super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = (BlockManager *)pp_Var5;
    if (_Var2._M_head_impl != (BlockManager *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_BlockManager + 8))();
    }
    TVar15._vptr_TableIOManager =
         (_func_int **)
         unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
         operator*(&this->block_manager);
    _Var16._M_head_impl = (TableIOManager *)operator_new(0x18);
    (_Var16._M_head_impl)->_vptr_TableIOManager = (_func_int **)&PTR__TableIOManager_019aff70;
    _Var16._M_head_impl[1]._vptr_TableIOManager = TVar15._vptr_TableIOManager;
    _Var16._M_head_impl[2]._vptr_TableIOManager = TVar9._vptr_TableIOManager;
    _Var3._M_head_impl =
         (this->table_io_manager).
         super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>
         .super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl;
    (this->table_io_manager).
    super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>.
    super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl = _Var16._M_head_impl;
    if (_Var3._M_head_impl != (TableIOManager *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_TableIOManager[1])();
    }
    pAVar1 = (this->super_StorageManager).db;
    _Var19._M_head_impl = (WriteAheadLog *)operator_new(0x70);
    WriteAheadLog::WriteAheadLog(_Var19._M_head_impl,pAVar1,&local_b8,0,NO_WAL);
    _Var4._M_head_impl =
         (this->super_StorageManager).wal.
         super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
         super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>
         .super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl;
    (this->super_StorageManager).wal.
    super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
    super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>.
    super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl = _Var19._M_head_impl;
    if (_Var4._M_head_impl != (WriteAheadLog *)0x0) {
      (**(code **)((long)(_Var4._M_head_impl)->_vptr_WriteAheadLog + 8))();
    }
    if (local_90.super_CheckpointReader._vptr_CheckpointReader != (_func_int **)0x0) {
      (**(code **)(*local_90.super_CheckpointReader._vptr_CheckpointReader + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  else {
    local_38 = (AttachedDatabase *)&storage_options.block_header_size;
    if (storage_options.block_header_size.index == 0xffffffffffffffff) {
      optional_idx::optional_idx
                ((optional_idx *)&local_b8,(pDVar8->options).default_block_header_size);
      local_78.block_header_size.index = (idx_t)local_b8._M_dataplus._M_p;
    }
    else {
      iVar12 = optional_idx::GetIndex((optional_idx *)local_38);
      Storage::VerifyBlockHeaderSize(iVar12);
      local_78.block_header_size.index = storage_options.block_header_size.index;
      local_78.encryption = storage_options.encryption;
      local_78.storage_version.index = storage_options.storage_version.index;
    }
    pAVar1 = (this->super_StorageManager).db;
    pSVar13 = (SingleFileBlockManager *)operator_new(0x240);
    SingleFileBlockManager::SingleFileBlockManager(pSVar13,pAVar1,path_p,&local_78);
    local_98._M_head_impl = (BlockManager *)pSVar13;
    pSVar14 = unique_ptr<duckdb::SingleFileBlockManager,_std::default_delete<duckdb::SingleFileBlockManager>,_true>
              ::operator->((unique_ptr<duckdb::SingleFileBlockManager,_std::default_delete<duckdb::SingleFileBlockManager>,_true>
                            *)&local_98);
    SingleFileBlockManager::LoadExistingDatabase(pSVar14);
    pFVar7 = local_48;
    _Var11._M_head_impl = local_98._M_head_impl;
    local_98._M_head_impl = (BlockManager *)0x0;
    this_00 = &this->block_manager;
    _Var2._M_head_impl =
         (this->block_manager).
         super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
         super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
         super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl;
    (this->block_manager).
    super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
    super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = _Var11._M_head_impl;
    if (_Var2._M_head_impl != (BlockManager *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_BlockManager + 8))();
    }
    TVar15._vptr_TableIOManager =
         (_func_int **)
         unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
         operator*(this_00);
    _Var16._M_head_impl = (TableIOManager *)operator_new(0x18);
    (_Var16._M_head_impl)->_vptr_TableIOManager = (_func_int **)&PTR__TableIOManager_019aff70;
    _Var16._M_head_impl[1]._vptr_TableIOManager = TVar15._vptr_TableIOManager;
    _Var16._M_head_impl[2]._vptr_TableIOManager = TVar9._vptr_TableIOManager;
    _Var3._M_head_impl =
         (this->table_io_manager).
         super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>
         .super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl;
    (this->table_io_manager).
    super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>.
    super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl = _Var16._M_head_impl;
    if (_Var3._M_head_impl != (TableIOManager *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_TableIOManager[1])();
    }
    if (storage_options.block_alloc_size.index != 0xffffffffffffffff) {
      iVar12 = optional_idx::GetIndex(&storage_options.block_alloc_size);
      pBVar17 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
                operator->(this_00);
      iVar18 = optional_idx::GetIndex(&pBVar17->block_alloc_size);
      if (iVar12 != iVar18) {
        pIVar20 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,
                   "block size parameter does not match the file\'s block size, got %llu, expected %llu"
                   ,"");
        iVar12 = optional_idx::GetIndex(&storage_options.block_alloc_size);
        pBVar17 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>
                  ::operator->(this_00);
        iVar18 = optional_idx::GetIndex(&pBVar17->block_alloc_size);
        InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
                  (pIVar20,&local_b8,iVar12,iVar18);
        __cxa_throw(pIVar20,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pAVar1 = local_38;
    if ((local_38->super_CatalogEntry)._vptr_CatalogEntry != (_func_int **)0xffffffffffffffff) {
      iVar12 = optional_idx::GetIndex((optional_idx *)local_38);
      pBVar17 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
                operator->(this_00);
      if ((pBVar17->block_header_size).index == 0xffffffffffffffff) {
        iVar18 = 8;
      }
      else {
        iVar18 = optional_idx::GetIndex(&pBVar17->block_header_size);
      }
      if (iVar12 != iVar18) {
        pIVar20 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,
                   "block header size does not match the file\'s block header size, got %llu, expected %llu"
                   ,"");
        iVar12 = optional_idx::GetIndex((optional_idx *)pAVar1);
        pBVar17 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>
                  ::operator->(this_00);
        iVar18 = 8;
        if ((pBVar17->block_header_size).index != 0xffffffffffffffff) {
          iVar18 = optional_idx::GetIndex(&pBVar17->block_header_size);
        }
        InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
                  (pIVar20,&local_b8,iVar12,iVar18);
        __cxa_throw(pIVar20,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    local_90.super_CheckpointReader.catalog = Catalog::GetCatalog((this->super_StorageManager).db);
    local_90.super_CheckpointReader._vptr_CheckpointReader =
         (_func_int **)&PTR__CheckpointReader_019afc50;
    local_90.storage = this;
    SingleFileCheckpointReader::LoadFromStorage(&local_90);
    StorageManager::GetWALPath_abi_cxx11_(&local_b8,&this->super_StorageManager);
    WriteAheadLog::Replay
              ((WriteAheadLog *)&stack0xffffffffffffffc0,pFVar7,(this->super_StorageManager).db,
               &local_b8);
    _Var19._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (WriteAheadLog *)0x0;
    _Var4._M_head_impl =
         (this->super_StorageManager).wal.
         super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
         super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>
         .super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl;
    (this->super_StorageManager).wal.
    super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
    super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>.
    super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl = _Var19._M_head_impl;
    if (_Var4._M_head_impl != (WriteAheadLog *)0x0) {
      (**(code **)((long)(_Var4._M_head_impl)->_vptr_WriteAheadLog + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if (local_98._M_head_impl != (BlockManager *)0x0) {
      (*(local_98._M_head_impl)->_vptr_BlockManager[1])();
    }
  }
  if (((_func_int **)0x1e000 < TVar9._vptr_TableIOManager) &&
     (iVar12 = optional_idx::GetIndex(&(this->super_StorageManager).storage_version), iVar12 < 4)) {
    pIVar20 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "Unsupported row group size %llu - row group sizes >= 122_880 are only supported with STORAGE_VERSION \'1.2.0\' or above.\nExplicitly specify a newer storage version when creating the database to enable larger row groups"
               ,"");
    InvalidInputException::InvalidInputException<unsigned_long>
              (pIVar20,&local_b8,(unsigned_long)TVar9._vptr_TableIOManager);
    __cxa_throw(pIVar20,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  (this->super_StorageManager).load_complete = true;
  return;
}

Assistant:

void SingleFileStorageManager::LoadDatabase(StorageOptions storage_options) {

	if (InMemory()) {
		block_manager = make_uniq<InMemoryBlockManager>(BufferManager::GetBufferManager(db), DEFAULT_BLOCK_ALLOC_SIZE,
		                                                DEFAULT_BLOCK_HEADER_STORAGE_SIZE);
		table_io_manager = make_uniq<SingleFileTableIOManager>(*block_manager, DEFAULT_ROW_GROUP_SIZE);
		return;
	}

	auto &fs = FileSystem::Get(db);
	auto &config = DBConfig::Get(db);

	StorageManagerOptions options;
	options.read_only = read_only;
	options.use_direct_io = config.options.use_direct_io;
	options.debug_initialize = config.options.debug_initialize;
	options.storage_version = storage_options.storage_version;

	idx_t row_group_size = DEFAULT_ROW_GROUP_SIZE;
	if (storage_options.row_group_size.IsValid()) {
		row_group_size = storage_options.row_group_size.GetIndex();
		if (row_group_size == 0) {
			throw NotImplementedException("Invalid row group size: %llu - row group size must be bigger than 0",
			                              row_group_size);
		}
		if (row_group_size % STANDARD_VECTOR_SIZE != 0) {
			throw NotImplementedException(
			    "Invalid row group size: %llu - row group size must be divisible by the vector size (%llu)",
			    row_group_size, STANDARD_VECTOR_SIZE);
		}
	}
	// Check if the database file already exists.
	// Note: a file can also exist if there was a ROLLBACK on a previous transaction creating that file.
	if (!read_only && !fs.FileExists(path)) {
		// file does not exist and we are in read-write mode
		// create a new file

		// check if a WAL file already exists
		auto wal_path = GetWALPath();
		if (fs.FileExists(wal_path)) {
			// WAL file exists but database file does not
			// remove the WAL
			fs.RemoveFile(wal_path);
		}

		// Set the block allocation size for the new database file.
		if (storage_options.block_alloc_size.IsValid()) {
			// Use the option provided by the user.
			Storage::VerifyBlockAllocSize(storage_options.block_alloc_size.GetIndex());
			options.block_alloc_size = storage_options.block_alloc_size;
		} else {
			// No explicit option provided: use the default option.
			options.block_alloc_size = config.options.default_block_alloc_size;
		}
		//! set the block header size for the encrypted database files
		//! set the database to encrypted
		//! update the storage version to 1.3.0
		if (storage_options.block_header_size.IsValid()) {
			// Use the header size for the corresponding encryption algorithm.
			Storage::VerifyBlockHeaderSize(storage_options.block_header_size.GetIndex());
			options.block_header_size = storage_options.block_header_size;
			options.encryption = storage_options.encryption;
			options.storage_version = storage_options.storage_version;
		} else {
			// No encryption; use the default option.
			options.block_header_size = config.options.default_block_header_size;
		}
		if (!options.storage_version.IsValid()) {
			// when creating a new database we default to the serialization version specified in the config
			options.storage_version = config.options.serialization_compatibility.serialization_version;
		}

		// Initialize the block manager before creating a new database.
		auto sf_block_manager = make_uniq<SingleFileBlockManager>(db, path, options);
		sf_block_manager->CreateNewDatabase();
		block_manager = std::move(sf_block_manager);
		table_io_manager = make_uniq<SingleFileTableIOManager>(*block_manager, row_group_size);
		wal = make_uniq<WriteAheadLog>(db, wal_path);
	} else {
		// Either the file exists, or we are in read-only mode, so we
		// try to read the existing file on disk.

		// set the block header size for the encrypted database files
		// (also if they already exist)
		if (storage_options.block_header_size.IsValid()) {
			Storage::VerifyBlockHeaderSize(storage_options.block_header_size.GetIndex());
			options.block_header_size = storage_options.block_header_size;
			options.encryption = storage_options.encryption;
			options.storage_version = storage_options.storage_version;
		} else {
			// No explicit option provided: use the default option.
			options.block_header_size = config.options.default_block_header_size;
		}

		// Initialize the block manager while loading the database file.
		// We'll construct the SingleFileBlockManager with the default block allocation size,
		// and later adjust it when reading the file header.
		auto sf_block_manager = make_uniq<SingleFileBlockManager>(db, path, options);
		sf_block_manager->LoadExistingDatabase();
		block_manager = std::move(sf_block_manager);
		table_io_manager = make_uniq<SingleFileTableIOManager>(*block_manager, row_group_size);

		if (storage_options.block_alloc_size.IsValid()) {
			// user-provided block alloc size
			idx_t block_alloc_size = storage_options.block_alloc_size.GetIndex();
			if (block_alloc_size != block_manager->GetBlockAllocSize()) {
				throw InvalidInputException(
				    "block size parameter does not match the file's block size, got %llu, expected %llu",
				    storage_options.block_alloc_size.GetIndex(), block_manager->GetBlockAllocSize());
			}
		}

		if (storage_options.block_header_size.IsValid()) {
			// block header size for encrypted database files
			idx_t block_header_size = storage_options.block_header_size.GetIndex();
			if (block_header_size != block_manager->GetBlockHeaderSize()) {
				throw InvalidInputException(
				    "block header size does not match the file's block header size, got %llu, expected %llu",
				    storage_options.block_header_size.GetIndex(), block_manager->GetBlockHeaderSize());
			}
		}

		// load the db from storage
		auto checkpoint_reader = SingleFileCheckpointReader(*this);
		checkpoint_reader.LoadFromStorage();

		auto wal_path = GetWALPath();
		wal = WriteAheadLog::Replay(fs, db, wal_path);
	}
	if (row_group_size > 122880ULL && GetStorageVersion() < 4) {
		throw InvalidInputException("Unsupported row group size %llu - row group sizes >= 122_880 are only supported "
		                            "with STORAGE_VERSION '1.2.0' or above.\nExplicitly specify a newer storage "
		                            "version when creating the database to enable larger row groups",
		                            row_group_size);
	}

	load_complete = true;
}